

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O3

uint64_t __thiscall
GmmLib::GmmResourceInfoCommon::Get2DFastClearSurfaceHeightFor3DSurface
          (GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *pGVar4;
  undefined4 extraout_var_00;
  
  uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])();
  uVar2 = (*this->_vptr_GmmResourceInfoCommon[0x18])(this,(ulong)MipLevel);
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
  pGVar4 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*pGVar4->_vptr_GmmTextureCalc[0x20])
                    (pGVar4,&this->Surf,(ulong)uVar1,(ulong)uVar2,pGVar4->_vptr_GmmTextureCalc[0x20]
                    );
  return CONCAT44(extraout_var_00,iVar3);
}

Assistant:

uint64_t GmmLib::GmmResourceInfoCommon::Get2DFastClearSurfaceHeightFor3DSurface(uint32_t MipLevel)
{
    uint64_t          height    = 0;
    uint32_t          mipHeight = GetMipHeight(MipLevel);
    uint32_t          mipDepth  = GetMipDepth(MipLevel);
    GMM_TEXTURE_CALC *pTextureCalc;

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());
    height       = pTextureCalc->Get2DFCSurfaceHeightFor3DSurface(&Surf, mipHeight, mipDepth);
    return height;
}